

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void call_internal_bif(char *nm,int err,int argc)

{
  CTcSymBif *pCVar1;
  uint in_EDX;
  undefined8 in_RDI;
  CTcSymBif *fn;
  
  pCVar1 = get_internal_bif((char *)fn,(int)((ulong)in_RDI >> 0x20));
  if (pCVar1 != (CTcSymBif *)0x0) {
    (*(pCVar1->super_CTcSymBifBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry._vptr_CVmHashEntry[0x1b])(pCVar1,0,(ulong)in_EDX,0,0);
  }
  return;
}

Assistant:

static void call_internal_bif(const char *nm, int err, int argc)
{
    /* look up the function */
    CTcSymBif *fn = get_internal_bif(nm, err);

    /* if we got it, call it */
    if (fn != 0)
        fn->gen_code_call(FALSE, argc, FALSE, 0);
}